

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_set<std::__cxx11::string>
          (App *this,string *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *member,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *options,string *description,bool defaulted)

{
  reference pvVar1;
  Option *this_00;
  string *description_00;
  allocator local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  string typeval;
  string local_2f8 [32];
  string local_2d8;
  undefined1 local_2b8 [32];
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_238;
  string local_218;
  callback_t fun;
  string simple_name;
  stringstream out;
  undefined1 local_1b0 [48];
  string local_180 [336];
  
  local_320 = member;
  detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&out,name,',');
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&out,0);
  ::std::__cxx11::string::string((string *)&simple_name,(string *)pvVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&out);
  _out = (pointer)local_320;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1b0,&options->_M_t);
  ::std::__cxx11::string::string(local_180,(string *)&simple_name);
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_set<std::__cxx11::string>(std::__cxx11::string,std::__cxx11::string&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string,bool)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)&fun,(anon_class_88_3_1d669d6f *)&out);
  add_set<std::__cxx11::string>(std::__cxx11::string,std::__cxx11::string&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string,bool)
  ::{lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)#1}::~vector
            ((_lambda_std__vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>__1_ *)
             &out);
  ::std::__cxx11::string::string((string *)&local_218,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_238,&fun);
  ::std::__cxx11::string::string((string *)&local_258,(string *)description);
  description_00 = &local_258;
  this_00 = add_option(this,&local_218,&local_238,description_00,defaulted);
  ::std::__cxx11::string::~string((string *)&local_258);
  std::_Function_base::~_Function_base(&local_238.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_218);
  ::std::__cxx11::string::string((string *)&typeval,"TEXT",(allocator *)&out);
  ::std::__cxx11::string::string((string *)local_2b8,",",&local_321);
  detail::
  join<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            ((string *)(local_2b8 + 0x20),(detail *)options,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2b8,description_00);
  ::std::operator+(&local_278," in {",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2b8 + 0x20));
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                   &local_278,"}");
  ::std::__cxx11::string::append((string *)&typeval);
  ::std::__cxx11::string::~string((string *)&out);
  ::std::__cxx11::string::~string((string *)&local_278);
  ::std::__cxx11::string::~string((string *)(local_2b8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2b8);
  ::std::__cxx11::string::string((string *)&local_2d8,(string *)&typeval);
  Option::set_custom_option(this_00,&local_2d8,1);
  ::std::__cxx11::string::~string((string *)&local_2d8);
  if (defaulted) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
    ::std::operator<<((ostream *)(local_1b0 + 8),(string *)local_320);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_assign((string *)&this_00->defaultval_);
    ::std::__cxx11::string::~string(local_2f8);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  }
  ::std::__cxx11::string::~string((string *)&typeval);
  std::_Function_base::~_Function_base(&fun.super__Function_base);
  ::std::__cxx11::string::~string((string *)&simple_name);
  return this_00;
}

Assistant:

Option *add_set(std::string name,
                    T &member,           ///< The selected member of the set
                    std::set<T> options, ///< The set of posibilities
                    std::string description,
                    bool defaulted) {

        std::string simple_name = CLI::detail::split(name, ',').at(0);
        CLI::callback_t fun = [&member, options, simple_name](CLI::results_t res) {
            bool retval = detail::lexical_cast(res[0], member);
            if(!retval)
                throw ConversionError(res[0], simple_name);
            return std::find(std::begin(options), std::end(options), member) != std::end(options);
        };

        Option *opt = add_option(name, fun, description, defaulted);
        std::string typeval = detail::type_name<T>();
        typeval += " in {" + detail::join(options) + "}";
        opt->set_custom_option(typeval);
        if(defaulted) {
            std::stringstream out;
            out << member;
            opt->set_default_str(out.str());
        }
        return opt;
    }